

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void __thiscall
EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
          (EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *this)

{
  key_type *in_RDI;
  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *this_00;
  key_equal *in_stack_ffffffffffffffd8;
  hasher *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  *in_stack_fffffffffffffff0;
  
  this_00 = (libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *)
            &stack0xfffffffffffffff5;
  google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>::
  libc_allocator_with_realloc(this_00);
  google::
  dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                   in_stack_ffffffffffffffd8,this_00);
  google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>::
  ~libc_allocator_with_realloc
            ((libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *)
             &stack0xfffffffffffffff5);
  HashObject<4,_4>::HashObject((HashObject<4,_4> *)&stack0xffffffffffffffe0,-1);
  google::
  dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::set_empty_key((dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                   *)this_00,in_RDI);
  HashObject<4,_4>::HashObject((HashObject<4,_4> *)&stack0xffffffffffffffdc,-2);
  google::
  dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::set_deleted_key((dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)this_00,in_RDI);
  return;
}

Assistant:

EasyUseDenseHashMap() {
    this->set_empty_key(-1);
    this->set_deleted_key(-2);
  }